

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_to_bytes(wally_psbt *psbt,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  uchar uVar1;
  int iVar2;
  wally_psbt_input *pwVar3;
  long lVar4;
  wally_psbt_output *pwVar5;
  int iVar6;
  size_t *psVar7;
  size_t sVar8;
  undefined1 *puVar9;
  long lVar10;
  ulong uVar11;
  uchar *w;
  size_t max;
  uchar *cursor;
  size_t wit_max;
  uchar wit_bytes [50];
  undefined1 local_491;
  size_t *local_490;
  size_t local_488;
  uchar *local_480;
  wally_psbt *local_478;
  uint local_46c;
  size_t *local_468;
  ulong local_460;
  size_t *local_458;
  size_t *local_450;
  size_t local_448;
  size_t *local_440;
  size_t local_438 [129];
  
  iVar6 = -2;
  if ((written != (size_t *)0x0) && (*written = 0, psbt != (wally_psbt *)0x0 && flags == 0)) {
    iVar2 = *(int *)psbt->magic;
    uVar1 = psbt->magic[4];
    local_488 = len;
    local_480 = bytes_out;
    push_bytes(&local_480,&local_488,psbt,5);
    push_psbt_key(&local_480,&local_488,0,(void *)0x0,0);
    iVar6 = push_length_and_tx(&local_480,&local_488,psbt->tx,0xc);
    if (iVar6 == 0) {
      local_478 = psbt;
      local_448 = len;
      local_440 = written;
      if (psbt->version != 0) {
        push_psbt_key(&local_480,&local_488,0xfb,(void *)0x0,0);
        push_varint(&local_480,&local_488,4);
        push_le32(&local_480,&local_488,local_478->version);
      }
      push_map(&local_480,&local_488,&local_478->unknowns);
      push_u8(&local_480,&local_488,'\0');
      if (local_478->num_inputs != 0) {
        lVar10 = 0;
        uVar11 = 0;
        local_46c = (uint)(uVar1 != 0xff || iVar2 != 0x74657370);
        do {
          pwVar3 = local_478->inputs;
          if (*(long *)((long)&pwVar3->utxo + lVar10) != 0) {
            push_psbt_key(&local_480,&local_488,0,(void *)0x0,0);
            iVar6 = push_length_and_tx(&local_480,&local_488,
                                       *(wally_tx **)((long)&pwVar3->utxo + lVar10),1);
            if (iVar6 != 0) {
              return iVar6;
            }
          }
          lVar4 = *(long *)((long)&pwVar3->witness_utxo + lVar10);
          if (local_46c == 0) {
            if (lVar4 != 0) {
              local_490 = (size_t *)
                          (*(long *)(lVar4 + 0x48) + (ulong)(*(long *)(lVar4 + 0x48) == 0) +
                           *(long *)(lVar4 + 0x38) + (ulong)(*(long *)(lVar4 + 0x38) == 0) +
                           *(long *)(lVar4 + 0x28) + (ulong)(*(long *)(lVar4 + 0x28) == 0) +
                           *(long *)(lVar4 + 0x10) + 1);
              psVar7 = local_438;
              local_450 = local_490;
              if (((size_t *)0x400 < local_490) &&
                 (psVar7 = (size_t *)wally_malloc((size_t)local_490), psVar7 == (size_t *)0x0)) {
                return -3;
              }
              local_468 = psVar7;
              local_460 = uVar11;
              local_458 = psVar7;
              push_psbt_key(&local_480,&local_488,1,(void *)0x0,0);
              puVar9 = *(undefined1 **)(lVar4 + 0x20);
              sVar8 = *(size_t *)(lVar4 + 0x28);
              if (puVar9 == (undefined1 *)0x0) {
                sVar8 = 1;
              }
              local_491 = 0;
              if (puVar9 == (undefined1 *)0x0) {
                puVar9 = &local_491;
              }
              push_bytes((uchar **)&local_468,(size_t *)&local_490,puVar9,sVar8);
              puVar9 = *(undefined1 **)(lVar4 + 0x30);
              sVar8 = *(size_t *)(lVar4 + 0x38);
              if (puVar9 == (undefined1 *)0x0) {
                sVar8 = 1;
              }
              local_491 = 0;
              if (puVar9 == (undefined1 *)0x0) {
                puVar9 = &local_491;
              }
              push_bytes((uchar **)&local_468,(size_t *)&local_490,puVar9,sVar8);
              puVar9 = *(undefined1 **)(lVar4 + 0x40);
              sVar8 = *(size_t *)(lVar4 + 0x48);
              if (puVar9 == (undefined1 *)0x0) {
                sVar8 = 1;
              }
              local_491 = 0;
              if (puVar9 == (undefined1 *)0x0) {
                puVar9 = &local_491;
              }
              push_bytes((uchar **)&local_468,(size_t *)&local_490,puVar9,sVar8);
              push_varbuff((uchar **)&local_468,(size_t *)&local_490,*(uchar **)(lVar4 + 8),
                           *(size_t *)(lVar4 + 0x10));
              psVar7 = local_450;
              if (local_490 == (size_t *)0x0) {
                push_varbuff(&local_480,&local_488,(uchar *)local_458,(size_t)local_450);
              }
              uVar11 = local_460;
              if (local_458 != local_438) {
                clear_and_free(local_458,(size_t)psVar7);
              }
              if (local_490 != (size_t *)0x0) {
                return -1;
              }
            }
          }
          else if (lVar4 != 0) {
            local_468 = (size_t *)0x32;
            local_490 = local_438;
            local_460 = uVar11;
            push_psbt_key(&local_480,&local_488,1,(void *)0x0,0);
            push_le64((uchar **)&local_490,(size_t *)&local_468,
                      **(uint64_t **)((long)&pwVar3->witness_utxo + lVar10));
            lVar4 = *(long *)((long)&pwVar3->witness_utxo + lVar10);
            push_varbuff((uchar **)&local_490,(size_t *)&local_468,*(uchar **)(lVar4 + 8),
                         *(size_t *)(lVar4 + 0x10));
            if (local_490 == (size_t *)0x0) {
              return -2;
            }
            push_varbuff(&local_480,&local_488,(uchar *)local_438,(long)local_490 - (long)local_438)
            ;
            uVar11 = local_460;
          }
          push_typed_map(&local_480,&local_488,2,
                         (wally_map *)((long)&(pwVar3->signatures).items + lVar10));
          if (*(int *)((long)&pwVar3->sighash + lVar10) != 0) {
            push_psbt_key(&local_480,&local_488,3,(void *)0x0,0);
            push_varint(&local_480,&local_488,4);
            push_le32(&local_480,&local_488,*(uint32_t *)((long)&pwVar3->sighash + lVar10));
          }
          push_typed_varbuff(&local_480,&local_488,4,
                             *(uchar **)((long)&pwVar3->redeem_script + lVar10),
                             *(size_t *)((long)&pwVar3->redeem_script_len + lVar10));
          push_typed_varbuff(&local_480,&local_488,5,
                             *(uchar **)((long)&pwVar3->witness_script + lVar10),
                             *(size_t *)((long)&pwVar3->witness_script_len + lVar10));
          push_typed_map(&local_480,&local_488,6,
                         (wally_map *)((long)&(pwVar3->keypaths).items + lVar10));
          push_typed_varbuff(&local_480,&local_488,7,
                             *(uchar **)((long)&pwVar3->final_scriptsig + lVar10),
                             *(size_t *)((long)&pwVar3->final_scriptsig_len + lVar10));
          if (*(long *)((long)&pwVar3->final_witness + lVar10) != 0) {
            local_438[0] = 0;
            push_psbt_key(&local_480,&local_488,8,(void *)0x0,0);
            push_witness_stack((uchar **)0x0,local_438,
                               *(wally_tx_witness_stack **)((long)&pwVar3->final_witness + lVar10));
            push_varint(&local_480,&local_488,local_438[0]);
            push_witness_stack(&local_480,&local_488,
                               *(wally_tx_witness_stack **)((long)&pwVar3->final_witness + lVar10));
          }
          if (*(int *)((long)&pwVar3->has_value + lVar10) != 0) {
            push_elements_key(&local_480,&local_488,0);
            push_varint(&local_480,&local_488,8);
            push_le64(&local_480,&local_488,*(uint64_t *)((long)&pwVar3->value + lVar10));
          }
          push_elements_varbuff
                    (&local_480,&local_488,1,*(uchar **)((long)&pwVar3->vbf + lVar10),
                     *(size_t *)((long)&pwVar3->vbf_len + lVar10));
          push_elements_varbuff
                    (&local_480,&local_488,2,*(uchar **)((long)&pwVar3->asset + lVar10),
                     *(size_t *)((long)&pwVar3->asset_len + lVar10));
          push_elements_varbuff
                    (&local_480,&local_488,3,*(uchar **)((long)&pwVar3->abf + lVar10),
                     *(size_t *)((long)&pwVar3->abf_len + lVar10));
          if (*(long *)((long)&pwVar3->pegin_tx + lVar10) != 0) {
            push_elements_key(&local_480,&local_488,4);
            iVar6 = push_length_and_tx(&local_480,&local_488,
                                       *(wally_tx **)((long)&pwVar3->pegin_tx + lVar10),1);
            if (iVar6 != 0) {
              return iVar6;
            }
          }
          push_elements_varbuff
                    (&local_480,&local_488,5,*(uchar **)((long)&pwVar3->txoutproof + lVar10),
                     *(size_t *)((long)&pwVar3->txoutproof_len + lVar10));
          push_elements_varbuff
                    (&local_480,&local_488,6,*(uchar **)((long)&pwVar3->genesis_blockhash + lVar10),
                     *(size_t *)((long)&pwVar3->genesis_blockhash_len + lVar10));
          push_elements_varbuff
                    (&local_480,&local_488,7,*(uchar **)((long)&pwVar3->claim_script + lVar10),
                     *(size_t *)((long)&pwVar3->claim_script_len + lVar10));
          push_map(&local_480,&local_488,(wally_map *)((long)&(pwVar3->unknowns).items + lVar10));
          push_u8(&local_480,&local_488,'\0');
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x110;
        } while (uVar11 < local_478->num_inputs);
      }
      if (local_478->num_outputs != 0) {
        lVar10 = 200;
        uVar11 = 0;
        do {
          pwVar5 = local_478->outputs;
          psVar7 = (size_t *)((long)&pwVar5->redeem_script + lVar10);
          push_typed_varbuff(&local_480,&local_488,0,(uchar *)psVar7[-0x19],psVar7[-0x18]);
          push_typed_varbuff(&local_480,&local_488,1,(uchar *)psVar7[-0x17],psVar7[-0x16]);
          push_typed_map(&local_480,&local_488,2,(wally_map *)(psVar7 + -0x15));
          push_elements_varbuff(&local_480,&local_488,0,(uchar *)psVar7[-0xd],psVar7[-0xc]);
          push_elements_varbuff(&local_480,&local_488,1,(uchar *)psVar7[-0xb],psVar7[-10]);
          push_elements_varbuff(&local_480,&local_488,2,(uchar *)psVar7[-9],psVar7[-8]);
          push_elements_varbuff(&local_480,&local_488,3,(uchar *)psVar7[-7],psVar7[-6]);
          push_elements_varbuff(&local_480,&local_488,4,(uchar *)psVar7[-3],psVar7[-2]);
          push_elements_varbuff(&local_480,&local_488,5,(uchar *)psVar7[-1],*psVar7);
          push_elements_varbuff(&local_480,&local_488,6,(uchar *)psVar7[-0xf],psVar7[-0xe]);
          push_elements_varbuff(&local_480,&local_488,7,(uchar *)psVar7[-5],psVar7[-4]);
          push_map(&local_480,&local_488,(wally_map *)((long)pwVar5 + lVar10 + -0x90));
          push_u8(&local_480,&local_488,'\0');
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0xd0;
        } while (uVar11 < local_478->num_outputs);
      }
      sVar8 = -local_488;
      if (local_480 == (uchar *)0x0) {
        sVar8 = local_488;
      }
      *local_440 = sVar8 + local_448;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int wally_psbt_to_bytes(const struct wally_psbt *psbt, uint32_t flags,
                        unsigned char *bytes_out, size_t len,
                        size_t *written)
{
    unsigned char *cursor = bytes_out;
    size_t max = len, i, is_elements;
    uint32_t tx_flags;
    int ret;

    if (written)
        *written = 0;

    if (flags != 0 || !written)
        return WALLY_EINVAL;

    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;

    tx_flags = is_elements ? WALLY_TX_FLAG_USE_ELEMENTS : 0;
    push_bytes(&cursor, &max, psbt->magic, sizeof(psbt->magic));

    /* Global tx */
    push_psbt_key(&cursor, &max, PSBT_GLOBAL_UNSIGNED_TX, NULL, 0);
    ret = push_length_and_tx(&cursor, &max, psbt->tx,
                             WALLY_TX_FLAG_ALLOW_PARTIAL | WALLY_TX_FLAG_PRE_BIP144);
    if (ret != WALLY_OK)
        return ret;

    /* version */
    if (psbt->version > 0) {
        push_psbt_key(&cursor, &max, PSBT_GLOBAL_VERSION, NULL, 0);
        push_varint(&cursor, &max, sizeof(uint32_t));
        push_le32(&cursor, &max, psbt->version);
    }

    /* Unknowns */
    push_map(&cursor, &max, &psbt->unknowns);

    /* Separator */
    push_u8(&cursor, &max, PSBT_SEPARATOR);

    /* Push each input and output */
    for (i = 0; i < psbt->num_inputs; ++i) {
        const struct wally_psbt_input *input = &psbt->inputs[i];
        if ((ret = push_psbt_input(&cursor, &max, tx_flags, input)) != WALLY_OK)
            return ret;
    }
    for (i = 0; i < psbt->num_outputs; ++i) {
        const struct wally_psbt_output *output = &psbt->outputs[i];
        if ((ret = push_psbt_output(&cursor, &max, output)) != WALLY_OK)
            return ret;
    }

    if (cursor == NULL) {
        /* Once cursor is NULL, max holds how many bytes we needed */
        *written = len + max;
    } else {
        *written = len - max;
    }

    return WALLY_OK;
}